

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O0

Vec_Ptr_t * Cnf_ManScanMapping(Cnf_Man_t *p,int fCollect,int fPreorder)

{
  int iVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMapped;
  int fPreorder_local;
  int fCollect_local;
  Cnf_Man_t *p_local;
  
  pObj = (Aig_Obj_t *)0x0;
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->pManAig->vObjs), local_2c < iVar1;
      local_2c = local_2c + 1) {
    pvVar2 = Vec_PtrEntry(p->pManAig->vObjs,local_2c);
    if (pvVar2 != (void *)0x0) {
      *(ulong *)((long)pvVar2 + 0x18) = *(ulong *)((long)pvVar2 + 0x18) & 0xffffffff0000003f;
    }
  }
  if (fCollect != 0) {
    pObj = (Aig_Obj_t *)Vec_PtrAlloc(1000);
  }
  p->aArea = 0;
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->pManAig->vCos), local_2c < iVar1;
      local_2c = local_2c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCos,local_2c);
    pAVar3 = Aig_ObjFanin0(pAVar3);
    iVar1 = Cnf_ManScanMapping_rec(p,pAVar3,(Vec_Ptr_t *)pObj,fPreorder);
    p->aArea = iVar1 + p->aArea;
  }
  return (Vec_Ptr_t *)pObj;
}

Assistant:

Vec_Ptr_t * Cnf_ManScanMapping( Cnf_Man_t * p, int fCollect, int fPreorder )
{
    Vec_Ptr_t * vMapped = NULL;
    Aig_Obj_t * pObj;
    int i;
    // clean all references
    Aig_ManForEachObj( p->pManAig, pObj, i )
        pObj->nRefs = 0;
    // allocate the array
    if ( fCollect )
        vMapped = Vec_PtrAlloc( 1000 );
    // collect nodes reachable from POs in the DFS order through the best cuts
    p->aArea = 0;
    Aig_ManForEachCo( p->pManAig, pObj, i )
        p->aArea += Cnf_ManScanMapping_rec( p, Aig_ObjFanin0(pObj), vMapped, fPreorder );
//    printf( "Variables = %6d. Clauses = %8d.\n", vMapped? Vec_PtrSize(vMapped) + Aig_ManCiNum(p->pManAig) + 1 : 0, p->aArea + 2 );
    return vMapped;
}